

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O2

Am_Constraint * __thiscall
Web_Constraint::Copy(Web_Constraint *this,Am_Slot *param_1,Am_Slot *new_slot)

{
  Am_Web_Create_Proc *pAVar1;
  Am_Web_Data *pAVar2;
  Am_Web_Data *in_prototype;
  Am_Web_Validate_Proc *pAVar3;
  Am_Web_Initialize_Proc *pAVar4;
  bool bVar5;
  Am_Web_Data *this_00;
  
  pAVar1 = this->owner->create_proc;
  if ((pAVar1 != (Am_Web_Create_Proc *)0x0) && (bVar5 = (*pAVar1)(new_slot), bVar5)) {
    pAVar2 = this->owner;
    in_prototype = pAVar2->prototype;
    this_00 = (Am_Web_Data *)operator_new(0x70);
    if (in_prototype == (Am_Web_Data *)0x0) {
      pAVar3 = pAVar2->validate_proc;
      (this_00->interface).super_Am_Constraint.super_Am_Registered_Type._vptr_Am_Registered_Type =
           (_func_int **)&PTR_ID_002ea980;
      (this_00->interface).owner = this_00;
      pAVar4 = pAVar2->initialize_proc;
      this_00->create_proc = pAVar2->create_proc;
      this_00->initialize_proc = pAVar4;
      this_00->validate_proc = pAVar3;
      this_00->validating = false;
      this_00->initialized = false;
      this_00->valid = false;
      this_00->prototype = (Am_Web_Data *)0x0;
      this_00->child = (Am_Web_Data *)0x0;
      this_00->sibling = (Am_Web_Data *)0x0;
      this_00->out_list = (Output_Port *)0x0;
      this_00->in_list = (Input_Port *)0x0;
      this_00->invalid_list = (Input_Port *)0x0;
      this_00->changed_first = (Input_Port *)0x0;
      this_00->changed_last = (Input_Port *)0x0;
    }
    else {
      Am_Web_Data::Am_Web_Data(this_00,in_prototype);
    }
    return &(this_00->interface).super_Am_Constraint;
  }
  return (Am_Constraint *)0x0;
}

Assistant:

Am_Constraint *
Web_Constraint::Copy(const Am_Slot &, const Am_Slot &new_slot)
{
  if (owner->create_proc && owner->create_proc(new_slot)) {
    if (owner->prototype)
      return *(new Am_Web_Data(owner->prototype));
    else
      return *(new Am_Web_Data(owner->create_proc, owner->initialize_proc,
                               owner->validate_proc));
  }
  return nullptr;
}